

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O0

int xmlThrDefSaveNoEmptyTags(int v)

{
  int iVar1;
  int ret;
  int v_local;
  
  xmlMutexLock(xmlThrDefMutex);
  iVar1 = xmlSaveNoEmptyTagsThrDef;
  xmlSaveNoEmptyTagsThrDef = v;
  xmlMutexUnlock(xmlThrDefMutex);
  return iVar1;
}

Assistant:

int xmlThrDefSaveNoEmptyTags(int v) {
    int ret;
    xmlMutexLock(xmlThrDefMutex);
    ret = xmlSaveNoEmptyTagsThrDef;
    xmlSaveNoEmptyTagsThrDef = v;
    xmlMutexUnlock(xmlThrDefMutex);
    return ret;
}